

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void jsonip::detail::
     stl_pushbackable_helper<std::vector<std::vector<A,std::allocator<A>>,std::allocator<std::vector<A,std::allocator<A>>>>>
     ::write<jsonip::writer<true>>
               (writer<true> *w,
               vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
               *t)

{
  bool bVar1;
  reference t_00;
  __normal_iterator<const_std::vector<A,_std::allocator<A>_>_*,_std::vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>_>
  local_28;
  __normal_iterator<const_std::vector<A,_std::allocator<A>_>_*,_std::vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>_>
  local_20;
  const_iterator it;
  vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
  *t_local;
  writer<true> *w_local;
  
  it._M_current = (vector<A,_std::allocator<A>_> *)t;
  writer<true>::array_start(w);
  local_20._M_current =
       (vector<A,_std::allocator<A>_> *)
       std::
       vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
       ::begin((vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
                *)it._M_current);
  while( true ) {
    local_28._M_current =
         (vector<A,_std::allocator<A>_> *)
         std::
         vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
         ::end((vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
                *)it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    t_00 = __gnu_cxx::
           __normal_iterator<const_std::vector<A,_std::allocator<A>_>_*,_std::vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>_>
           ::operator*(&local_20);
    stl_pushbackable_helper<std::vector<A,std::allocator<A>>>::write<jsonip::writer<true>>(w,t_00);
    __gnu_cxx::
    __normal_iterator<const_std::vector<A,_std::allocator<A>_>_*,_std::vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>_>
    ::operator++(&local_20);
  }
  writer<true>::array_end(w);
  return;
}

Assistant:

static void write(Writer& w, const T& t)
        {
            w.array_start();
            for (typename T::const_iterator it = t.begin(); it != t.end(); ++it)
            {
                slice_helper::type::write(w, *it);
            }
            w.array_end();
        }